

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestResultCollector.cpp
# Opt level: O2

void __thiscall CppUnit::TestResultCollector::freeFailures(TestResultCollector *this)

{
  undefined1 local_60 [8];
  iterator itFailure;
  
  local_60 = (undefined1  [8])
             (this->m_failures).
             super__Deque_base<CppUnit::TestFailure_*,_std::allocator<CppUnit::TestFailure_*>_>.
             _M_impl.super__Deque_impl_data._M_start._M_cur;
  itFailure._M_cur =
       (this->m_failures).
       super__Deque_base<CppUnit::TestFailure_*,_std::allocator<CppUnit::TestFailure_*>_>._M_impl.
       super__Deque_impl_data._M_start._M_first;
  itFailure._M_first =
       (this->m_failures).
       super__Deque_base<CppUnit::TestFailure_*,_std::allocator<CppUnit::TestFailure_*>_>._M_impl.
       super__Deque_impl_data._M_start._M_last;
  itFailure._M_last =
       (_Elt_pointer)
       (this->m_failures).
       super__Deque_base<CppUnit::TestFailure_*,_std::allocator<CppUnit::TestFailure_*>_>._M_impl.
       super__Deque_impl_data._M_start._M_node;
  while (local_60 !=
         (undefined1  [8])
         (this->m_failures).
         super__Deque_base<CppUnit::TestFailure_*,_std::allocator<CppUnit::TestFailure_*>_>._M_impl.
         super__Deque_impl_data._M_finish._M_cur) {
    std::_Deque_iterator<CppUnit::TestFailure_*,_CppUnit::TestFailure_*&,_CppUnit::TestFailure_**>::
    operator++((_Self *)&itFailure._M_node,
               (_Deque_iterator<CppUnit::TestFailure_*,_CppUnit::TestFailure_*&,_CppUnit::TestFailure_**>
                *)local_60,0);
    if (*itFailure._M_node != (TestFailure **)0x0) {
      (*(code *)(**itFailure._M_node)->m_failedTest)();
    }
  }
  std::deque<CppUnit::TestFailure_*,_std::allocator<CppUnit::TestFailure_*>_>::clear
            (&this->m_failures);
  return;
}

Assistant:

void 
TestResultCollector::freeFailures()
{
  TestFailures::iterator itFailure = m_failures.begin();
  while ( itFailure != m_failures.end() )
    delete *itFailure++;
  m_failures.clear();
}